

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O1

void gimage::loadViewProperties(Properties *prop,char *name,char *spath,bool verbose)

{
  char *pcVar1;
  double *pdVar2;
  pointer pcVar3;
  pointer pbVar4;
  pointer pbVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  ostream *poVar9;
  long *plVar10;
  long lVar11;
  undefined7 in_register_00000009;
  long *plVar12;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  pointer pbVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string s;
  Vector3d T;
  string depthname;
  double t;
  Properties mprop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  undefined4 local_164;
  char *local_160;
  SMatrix<double,_3,_3> local_158;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  SVector<double,_3> local_e8;
  long lStack_d0;
  string local_c8;
  char *local_a8;
  undefined1 *local_a0;
  ulong local_98;
  undefined1 local_90 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  long lVar19;
  
  local_164 = (undefined4)CONCAT71(in_register_00000009,verbose);
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_158,name,(allocator *)&local_80);
  gutil::split((vector *)&local_188,(string *)&local_158,',',true);
  pdVar2 = local_158.v[0] + 2;
  if ((double *)local_158.v[0][0] != pdVar2) {
    operator_delete((void *)local_158.v[0][0]);
  }
  if ((ulong)((long)local_188.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_188.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    bVar17 = false;
  }
  else {
    uVar14 = 1;
    lVar15 = 0x20;
    bVar17 = false;
    local_160 = spath;
    do {
      iVar7 = std::__cxx11::string::compare
                        ((long)&((local_188.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar15,0,(char *)0x2);
      if (iVar7 == 0) {
        std::__cxx11::string::substr
                  ((ulong)&local_158,
                   (long)&((local_188.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar15);
        gutil::Properties::load((char *)prop);
        if ((double *)local_158.v[0][0] != pdVar2) {
          operator_delete((void *)local_158.v[0][0]);
        }
        bVar17 = true;
      }
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0x20;
      spath = local_160;
    } while (uVar14 < (ulong)((long)local_188.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_188.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (!bVar17) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    pcVar3 = ((local_188.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar3,
               pcVar3 + (local_188.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    pbVar5 = local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar16 = local_188.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        pcVar3 = (pbVar16->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != &pbVar16->field_2) {
          operator_delete(pcVar3);
        }
        pbVar16 = pbVar16 + 1;
      } while (pbVar16 != pbVar5);
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
    }
    getPrefixAlternatives(&local_188,&local_c8,spath);
    uVar8 = (uint)((ulong)((long)local_188.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_188.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5);
    if (0 < (int)uVar8) {
      local_160 = (char *)(ulong)(uVar8 & 0x7fffffff);
      do {
        pcVar1 = local_160 + -1;
        lVar15 = 0;
        pcVar6 = pcVar1;
        local_a8 = local_160;
        do {
          local_160 = pcVar6;
          pcVar3 = local_188.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)pcVar1]._M_dataplus._M_p;
          local_158.v[0][0] = (double)pdVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,pcVar3,
                     pcVar3 + local_188.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[(long)pcVar1].
                              _M_string_length);
          std::__cxx11::string::append((char *)&local_158);
          gutil::Properties::load((char *)prop);
          if ((double *)local_158.v[0][0] != pdVar2) {
            operator_delete((void *)local_158.v[0][0]);
          }
          if ((char)local_164 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Using parameter file: ",0x16);
            pcVar3 = local_188.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)pcVar1]._M_dataplus._M_p;
            local_158.v[0][0] = (double)pdVar2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_158,pcVar3,
                       pcVar3 + local_188.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)pcVar1].
                                _M_string_length);
            std::__cxx11::string::append((char *)&local_158);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_158.v[0][0],
                                (long)local_158.v[0][1]);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if ((double *)local_158.v[0][0] != pdVar2) {
              operator_delete((void *)local_158.v[0][0]);
            }
          }
          lVar15 = lVar15 + 8;
          pcVar6 = local_160;
        } while (lVar15 != 0x20);
      } while (1 < (long)local_a8);
    }
    lVar15 = std::__cxx11::string::find_last_of((char *)&local_c8,0x12f633,0xffffffffffffffff);
    if (local_c8._M_string_length - (lVar15 + 1) < 9) {
      bVar17 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&local_c8);
      iVar7 = std::__cxx11::string::compare((char *)local_50);
      bVar17 = iVar7 == 0;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    if (bVar17) {
      std::__cxx11::string::substr((ulong)&local_158,(ulong)&local_c8);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_158);
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_f8 = *plVar12;
        lStack_f0 = plVar10[3];
        local_108 = &local_f8;
      }
      else {
        local_f8 = *plVar12;
        local_108 = (long *)*plVar10;
      }
      local_100 = plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((double *)local_158.v[0][0] != pdVar2) {
        operator_delete((void *)local_158.v[0][0]);
      }
      local_80._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_80._M_impl.super__Rb_tree_header._M_header;
      local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_80._M_impl.super__Rb_tree_header._M_header._M_right =
           local_80._M_impl.super__Rb_tree_header._M_header._M_left;
      gutil::Properties::load((char *)&local_80);
      if ((char)local_164 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Using Middlebury calibration file: ",0x23);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_108,local_100);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      gutil::Properties::getString((char *)&local_80,(string *)0x12f695,(char *)&local_108);
      gutil::Properties::putString((char *)prop,(string *)"camera.width");
      gutil::Properties::getString((char *)&local_80,(string *)0x12f6a2,(char *)&local_108);
      gutil::Properties::putString((char *)prop,(string *)"camera.height");
      local_158.v[2][0] = 0.0;
      local_158.v[2][1] = 0.0;
      local_158.v[1][1] = 0.0;
      local_158.v[1][2] = 0.0;
      local_158.v[0][2] = 0.0;
      local_158.v[1][0] = 0.0;
      local_158.v[0][0] = 0.0;
      local_158.v[0][1] = 0.0;
      local_158.v[2][2] = 0.0;
      lVar11 = 0;
      auVar18 = _DAT_0012f020;
      do {
        if (SUB164(auVar18 ^ _DAT_0012f030,4) == DAT_0012f530._4_4_ &&
            SUB164(auVar18 ^ _DAT_0012f030,0) < (int)DAT_0012f530) {
          *(undefined8 *)((long)local_158.v[0] + lVar11) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_158.v[1] + lVar11 + 8) = 0x3ff0000000000000;
        }
        lVar19 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 2;
        auVar18._8_8_ = lVar19 + 2;
        lVar11 = lVar11 + 0x40;
      } while (lVar11 != 0x80);
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"cam","");
      plVar10 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_a0,local_98,0,'\x01');
      pdVar2 = local_e8.v + 2;
      pdVar13 = (double *)(plVar10 + 2);
      if ((double *)*plVar10 == pdVar13) {
        local_e8.v[2] = *pdVar13;
        lStack_d0 = plVar10[3];
        local_e8.v[0] = (double)pdVar2;
      }
      else {
        local_e8.v[2] = *pdVar13;
        local_e8.v[0] = (double)*plVar10;
      }
      local_e8.v[1] = (double)plVar10[1];
      *plVar10 = (long)pdVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
                ((Properties *)&local_80,(char *)local_e8.v[0],&local_158,(char *)0x0);
      if ((double *)local_e8.v[0] != pdVar2) {
        operator_delete((void *)local_e8.v[0]);
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      gutil::Properties::putValue<gmath::SMatrix<double,3,3>>(prop,"camera.A",&local_158);
      gutil::Properties::putValue<double>(prop,"f",(double *)&local_158);
      gutil::Properties::getValue<double>
                ((Properties *)&local_80,"baseline",(double *)&local_a0,(char *)0x0);
      gutil::Properties::putValue<double>(prop,"t",(double *)&local_a0);
      gutil::Properties::getString((char *)&local_80,(string *)"doffs",(char *)&local_108);
      gutil::Properties::putString((char *)prop,(string *)"disp.offset");
      local_e8.v[0] = (double)pdVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"[1 0 0; 0 1 0; 0 0 1]","");
      gutil::Properties::putString((char *)prop,(string *)"camera.R");
      if ((double *)local_e8.v[0] != pdVar2) {
        operator_delete((void *)local_e8.v[0]);
      }
      local_e8.v[2] = 0.0;
      local_e8.v[1] = 0.0;
      local_e8.v[0] = (double)(local_c8._M_dataplus._M_p[lVar15 + 5] + -0x30) * (double)local_a0;
      gutil::Properties::putValue<gmath::SVector<double,3>>(prop,"camera.T",&local_e8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_80);
      if (local_108 != &local_f8) {
        operator_delete(local_108);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  return;
}

Assistant:

void loadViewProperties(gutil::Properties &prop, const char *name, const char *spath,
                        bool verbose)
{
  std::vector<std::string> list;

  // load parameter files as specified in name

  gutil::split(list, name, ',');

  bool expl=false;

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 2, "p=") == 0)
    {
      prop.load(list[i].substr(2).c_str());
      expl=true;
    }
  }

  // alternatively, search for parameter files

  if (!expl)
  {
    std::string depthname=list[0];
    const char *suffix[]= {".txt", ".TXT", "_param.txt", "_PARAM.TXT"};

    list.clear();
    getPrefixAlternatives(list, depthname, spath);

    for (int i=static_cast<int>(list.size())-1; i>=0; i--)
    {
      for (int k=0; k<4; k++)
      {
        // try all possibilities and add parameters

        try
        {
          prop.load((list[i]+suffix[k]).c_str());

          if (verbose)
          {
            std::cout << "Using parameter file: " << list[i]+suffix[k] << std::endl;
          }
        }
        catch (const gutil::Exception &)
        { }
      }
    }

    // support format of Middlebury stereo benchmark data sets

    size_t pos;

    pos=depthname.find_last_of("/\\");

    if (pos == depthname.npos)
    {
      pos=0;
    }
    else
    {
      pos++;
    }

    if (depthname.size()-pos >= 9 && depthname.substr(pos, 4) == "disp")
    {
      try
      {
        std::string s=depthname.substr(0, pos)+"calib.txt";
        gutil::Properties mprop;
        mprop.load(s.c_str());

        if (verbose)
        {
          std::cout << "Using Middlebury calibration file: " << s << std::endl;
        }

        mprop.getString("width", s, "0");
        prop.putString("camera.width", s);
        mprop.getString("height", s, "0");
        prop.putString("camera.height", s);

        gmath::Matrix33d A;
        mprop.getValue((std::string("cam")+depthname[pos+4]).c_str(), A);
        prop.putValue("camera.A", A);

        prop.putValue("f", A(0, 0));

        double t;
        mprop.getValue("baseline", t);
        prop.putValue("t", t);

        mprop.getString("doffs", s, "0");
        prop.putString("disp.offset", s);

        prop.putString("camera.R", "[1 0 0; 0 1 0; 0 0 1]");

        gmath::Vector3d T;
        T[0]=t*(depthname[pos+4]-'0');
        prop.putValue("camera.T", T);
      }
      catch (const gutil::IOException &)
      { }
      catch (const gutil::Exception &ex)
      {
        std::cerr << ex.what() << std::endl;
      }
    }
  }
}